

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O1

void __thiscall
ImportSource_removeImportSourceByIndex_Test::~ImportSource_removeImportSourceByIndex_Test
          (ImportSource_removeImportSourceByIndex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportSource, removeImportSourceByIndex)
{
    auto importer = libcellml::Importer::create();

    auto importSource = libcellml::ImportSource::create();

    importer->addImportSource(importSource);

    EXPECT_EQ(size_t(1), importer->importSourceCount());

    EXPECT_TRUE(importer->removeImportSource(0));

    EXPECT_EQ(size_t(0), importer->importSourceCount());

    EXPECT_FALSE(importer->removeImportSource(0));
}